

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O0

bool testing::internal::UnitTestOptions::FilterMatchesTest(string *test_case_name,string *test_name)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  char *pcVar3;
  char *__end;
  ulong uVar4;
  byte local_159;
  allocator local_109;
  string local_108 [39];
  allocator<char> local_e1;
  string local_e0 [32];
  string local_c0 [8];
  string negative;
  string positive;
  char *dash;
  char *p;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  string *full_name;
  string *test_name_local;
  string *test_case_name_local;
  
  full_name = test_name;
  test_name_local = test_case_name;
  std::operator+(&local_60,test_case_name,".");
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::operator+(&local_40,&local_60,pcVar3);
  std::__cxx11::string::~string((string *)&local_60);
  local_20 = &local_40;
  pcVar3 = (char *)std::__cxx11::string::c_str();
  __end = strchr(pcVar3,0x2d);
  std::__cxx11::string::string((string *)(negative.field_2._M_local_buf + 8));
  std::__cxx11::string::string(local_c0);
  if (__end == (char *)0x0) {
    pcVar3 = (char *)std::__cxx11::string::c_str();
    std::__cxx11::string::operator=((string *)(negative.field_2._M_local_buf + 8),pcVar3);
    std::__cxx11::string::operator=(local_c0,"");
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<char_const*,void>(local_e0,pcVar3,__end,&local_e1);
    std::__cxx11::string::operator=((string *)(negative.field_2._M_local_buf + 8),local_e0);
    std::__cxx11::string::~string(local_e0);
    std::allocator<char>::~allocator(&local_e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_108,__end + 1,&local_109);
    std::__cxx11::string::operator=(local_c0,local_108);
    std::__cxx11::string::~string(local_108);
    std::allocator<char>::~allocator((allocator<char> *)&local_109);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) != 0) {
      std::__cxx11::string::operator=((string *)(negative.field_2._M_local_buf + 8),"*");
    }
  }
  pbVar1 = local_20;
  pcVar3 = (char *)std::__cxx11::string::c_str();
  bVar2 = MatchesFilter(pbVar1,pcVar3);
  pbVar1 = local_20;
  local_159 = 0;
  if (bVar2) {
    pcVar3 = (char *)std::__cxx11::string::c_str();
    bVar2 = MatchesFilter(pbVar1,pcVar3);
    local_159 = bVar2 ^ 0xff;
  }
  std::__cxx11::string::~string(local_c0);
  std::__cxx11::string::~string((string *)(negative.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_40);
  return (bool)(local_159 & 1);
}

Assistant:

bool UnitTestOptions::FilterMatchesTest(const std::string &test_case_name,
                                        const std::string &test_name) {
  const std::string& full_name = test_case_name + "." + test_name.c_str();

  // Split --gtest_filter at '-', if there is one, to separate into
  // positive filter and negative filter portions
  const char* const p = GTEST_FLAG(filter).c_str();
  const char* const dash = strchr(p, '-');
  std::string positive;
  std::string negative;
  if (dash == NULL) {
    positive = GTEST_FLAG(filter).c_str();  // Whole string is a positive filter
    negative = "";
  } else {
    positive = std::string(p, dash);   // Everything up to the dash
    negative = std::string(dash + 1);  // Everything after the dash
    if (positive.empty()) {
      // Treat '-test1' as the same as '*-test1'
      positive = kUniversalFilter;
    }
  }

  // A filter is a colon-separated list of patterns.  It matches a
  // test if any pattern in it matches the test.
  return (MatchesFilter(full_name, positive.c_str()) &&
          !MatchesFilter(full_name, negative.c_str()));
}